

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_function_catalog_entry.cpp
# Opt level: O3

void __thiscall
duckdb::PragmaFunctionCatalogEntry::PragmaFunctionCatalogEntry
          (PragmaFunctionCatalogEntry *this,Catalog *catalog,SchemaCatalogEntry *schema,
          CreatePragmaFunctionInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pPVar5;
  
  FunctionEntry::FunctionEntry
            (&this->super_FunctionEntry,PRAGMA_FUNCTION_ENTRY,catalog,schema,
             &info->super_CreateFunctionInfo);
  (this->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
  _vptr_CatalogEntry = (_func_int **)&PTR__PragmaFunctionCatalogEntry_02454c70;
  paVar1 = &(this->functions).super_FunctionSet<duckdb::PragmaFunction>.name.field_2;
  (this->functions).super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p =
       (pointer)paVar1;
  pcVar3 = (info->functions).super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p;
  paVar2 = &(info->functions).super_FunctionSet<duckdb::PragmaFunction>.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)
             ((long)&(info->functions).super_FunctionSet<duckdb::PragmaFunction>.name.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)
     ((long)&(this->functions).super_FunctionSet<duckdb::PragmaFunction>.name.field_2 + 8) = uVar4;
  }
  else {
    (this->functions).super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p = pcVar3;
    (this->functions).super_FunctionSet<duckdb::PragmaFunction>.name.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->functions).super_FunctionSet<duckdb::PragmaFunction>.name._M_string_length =
       (info->functions).super_FunctionSet<duckdb::PragmaFunction>.name._M_string_length;
  (info->functions).super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p =
       (pointer)paVar2;
  (info->functions).super_FunctionSet<duckdb::PragmaFunction>.name._M_string_length = 0;
  (info->functions).super_FunctionSet<duckdb::PragmaFunction>.name.field_2._M_local_buf[0] = '\0';
  pPVar5 = *(pointer *)
            ((long)&(info->functions).super_FunctionSet<duckdb::PragmaFunction>.functions.
                    super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
                    super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>
                    ._M_impl.super__Vector_impl_data + 8);
  (this->functions).super_FunctionSet<duckdb::PragmaFunction>.functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_start =
       (info->functions).super_FunctionSet<duckdb::PragmaFunction>.functions.
       super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
       super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->functions).super_FunctionSet<duckdb::PragmaFunction>.functions.
           super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           _M_impl.super__Vector_impl_data + 8) = pPVar5;
  *(pointer *)
   ((long)&(this->functions).super_FunctionSet<duckdb::PragmaFunction>.functions.
           super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           _M_impl.super__Vector_impl_data + 0x10) =
       *(pointer *)
        ((long)&(info->functions).super_FunctionSet<duckdb::PragmaFunction>.functions.
                super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
                super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
                _M_impl.super__Vector_impl_data + 0x10);
  *(pointer *)
   ((long)&(info->functions).super_FunctionSet<duckdb::PragmaFunction>.functions.
           super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (info->functions).super_FunctionSet<duckdb::PragmaFunction>.functions.
  super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
  super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(info->functions).super_FunctionSet<duckdb::PragmaFunction>.functions.
           super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           super__Vector_base<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  return;
}

Assistant:

PragmaFunctionCatalogEntry::PragmaFunctionCatalogEntry(Catalog &catalog, SchemaCatalogEntry &schema,
                                                       CreatePragmaFunctionInfo &info)
    : FunctionEntry(CatalogType::PRAGMA_FUNCTION_ENTRY, catalog, schema, info), functions(std::move(info.functions)) {
}